

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

void __thiscall YAML::Scanner::StartStream(Scanner *this)

{
  IndentMarker *this_00;
  stack<YAML::Scanner::IndentMarker_*,_std::deque<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>_>
  *this_01;
  long in_RDI;
  unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_> pIndent
  ;
  pointer in_stack_ffffffffffffffa8;
  ptr_vector<YAML::Scanner::IndentMarker> *in_stack_ffffffffffffffb0;
  
  *(undefined1 *)(in_RDI + 0xd0) = 1;
  *(undefined1 *)(in_RDI + 0xd2) = 1;
  this_00 = (IndentMarker *)operator_new(0x18);
  IndentMarker::IndentMarker(this_00,-1,NONE);
  std::unique_ptr<YAML::Scanner::IndentMarker,std::default_delete<YAML::Scanner::IndentMarker>>::
  unique_ptr<std::default_delete<YAML::Scanner::IndentMarker>,void>
            ((unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
              *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  ptr_vector<YAML::Scanner::IndentMarker>::push_back
            (in_stack_ffffffffffffffb0,
             (unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
              *)in_stack_ffffffffffffffa8);
  this_01 = (stack<YAML::Scanner::IndentMarker_*,_std::deque<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>_>
             *)(in_RDI + 0x128);
  ptr_vector<YAML::Scanner::IndentMarker>::back((ptr_vector<YAML::Scanner::IndentMarker> *)0xf161e2)
  ;
  std::
  stack<YAML::Scanner::IndentMarker_*,_std::deque<YAML::Scanner::IndentMarker_*,_std::allocator<YAML::Scanner::IndentMarker_*>_>_>
  ::push(this_01,(value_type *)in_stack_ffffffffffffffa8);
  std::unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>::
  ~unique_ptr((unique_ptr<YAML::Scanner::IndentMarker,_std::default_delete<YAML::Scanner::IndentMarker>_>
               *)this_01);
  return;
}

Assistant:

void Scanner::StartStream() {
  m_startedStream = true;
  m_simpleKeyAllowed = true;
  std::unique_ptr<IndentMarker> pIndent(
      new IndentMarker(-1, IndentMarker::NONE));
  m_indentRefs.push_back(std::move(pIndent));
  m_indents.push(&m_indentRefs.back());
}